

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O3

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_min
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t ch,diff_t mm,second_t ss)

{
  long lVar1;
  char cVar2;
  char mm_00;
  char hh_00;
  long lVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  fields fVar7;
  
  lVar4 = mm % 0x3c;
  lVar6 = (lVar4 >> 0x3f) + ch + mm / 0x3c;
  lVar3 = (hh / 6 + (hh >> 0x3f) >> 2) - (hh >> 0x3f);
  lVar1 = lVar6 / 0x18;
  cVar5 = (char)lVar6 + (char)lVar1 * -0x18 + (char)hh + (char)lVar3 * -0x18;
  mm_00 = (char)lVar4 + '<';
  if (-1 < lVar4) {
    mm_00 = (char)lVar4;
  }
  cVar2 = (char)((uint)(int)(short)(cVar5 * 0x2b) >> 10) - (cVar5 >> 7);
  cVar5 = cVar5 + cVar2 * -0x18;
  hh_00 = cVar5 + '\x18';
  if (-1 < cVar5) {
    hh_00 = cVar5;
  }
  fVar7 = n_mon(y,m,d,(long)(cVar5 >> 7) + lVar1 + lVar3 + (long)cVar2,hh_00,mm_00,ss);
  fVar7._8_8_ = fVar7._8_8_ & 0xffffffffff;
  return fVar7;
}

Assistant:

CONSTEXPR_F fields n_min(year_t y, diff_t m, diff_t d, diff_t hh, diff_t ch,
                         diff_t mm, second_t ss) noexcept {
  ch += mm / 60;
  mm %= 60;
  if (mm < 0) {
    ch -= 1;
    mm += 60;
  }
  return n_hour(y, m, d, hh / 24 + ch / 24, hh % 24 + ch % 24,
                static_cast<minute_t>(mm), ss);
}